

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_CutMergeSimple(Sbd_Man_t *p,int *pCut1,int *pCut2,int *pCut)

{
  int iVar1;
  int iVar2;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  int *pBeg;
  int *pCut_local;
  int *pCut2_local;
  int *pCut1_local;
  Sbd_Man_t *p_local;
  
  pBeg1 = pCut + 1;
  pBeg2 = pCut1 + 1;
  pEnd1 = pCut2 + 1;
  iVar2 = *pCut1;
  iVar1 = *pCut2;
  while (pBeg2 < pCut1 + (long)iVar2 + 1 && pEnd1 < pCut2 + (long)iVar1 + 1) {
    if (*pBeg2 == *pEnd1) {
      *pBeg1 = *pBeg2;
      pEnd1 = pEnd1 + 1;
      pBeg2 = pBeg2 + 1;
    }
    else if (*pBeg2 < *pEnd1) {
      *pBeg1 = *pBeg2;
      pBeg2 = pBeg2 + 1;
    }
    else {
      *pBeg1 = *pEnd1;
      pEnd1 = pEnd1 + 1;
    }
    pBeg1 = pBeg1 + 1;
  }
  while (pBeg2 < pCut1 + (long)iVar2 + 1) {
    *pBeg1 = *pBeg2;
    pBeg2 = pBeg2 + 1;
    pBeg1 = pBeg1 + 1;
  }
  while (pEnd1 < pCut2 + (long)iVar1 + 1) {
    *pBeg1 = *pEnd1;
    pEnd1 = pEnd1 + 1;
    pBeg1 = pBeg1 + 1;
  }
  iVar2 = (int)((long)pBeg1 - (long)pCut >> 2) + -1;
  *pCut = iVar2;
  return iVar2;
}

Assistant:

int Sbd_CutMergeSimple( Sbd_Man_t * p, int * pCut1, int * pCut2, int * pCut )
{
    int * pBeg  = pCut + 1;
    int * pBeg1 = pCut1 + 1;
    int * pBeg2 = pCut2 + 1;
    int * pEnd1 = pCut1 + 1 + pCut1[0];
    int * pEnd2 = pCut2 + 1 + pCut2[0];
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    return (pCut[0] = pBeg - pCut - 1);
}